

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall
QProcessEnvironmentPrivate::insert
          (QProcessEnvironmentPrivate *this,QProcessEnvironmentPrivate *other)

{
  bool bVar1;
  QByteArray *key;
  QMap<QByteArray,_QProcEnvValue> *in_RDI;
  long in_FS_OFFSET;
  const_iterator nend;
  const_iterator nit;
  const_iterator end;
  const_iterator it;
  OrderedNameMapMutexLocker locker;
  QProcessEnvironmentPrivate *in_stack_ffffffffffffff28;
  OrderedNameMapMutexLocker *in_stack_ffffffffffffff30;
  piter *in_stack_ffffffffffffff38;
  const_iterator *this_00;
  QHash<QString,_QByteArray> *in_stack_ffffffffffffff48;
  QProcEnvValue *value;
  piter local_40;
  const_iterator local_30;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_node =
       (_Base_ptr)
       QMap<QByteArray,_QProcEnvValue>::constBegin
                 ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff28);
  local_30._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_30._M_node =
       (_Base_ptr)
       QMap<QByteArray,_QProcEnvValue>::constEnd
                 ((QMap<QByteArray,_QProcEnvValue> *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = ::operator!=((const_iterator *)in_stack_ffffffffffffff30,
                         (const_iterator *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    value = (QProcEnvValue *)(in_RDI + 1);
    key = QMap<QByteArray,_QProcEnvValue>::const_iterator::key((const_iterator *)0x78eb06);
    QMap<QByteArray,_QProcEnvValue>::const_iterator::value((const_iterator *)0x78eb18);
    QMap<QByteArray,_QProcEnvValue>::insert(in_RDI,key,value);
    QMap<QByteArray,_QProcEnvValue>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff30);
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  OrderedNameMapMutexLocker::OrderedNameMapMutexLocker
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (QProcessEnvironmentPrivate *)0x78eb82);
  local_40.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d = (Data<QHashPrivate::Node<QString,_QByteArray>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = (piter)QHash<QString,_QByteArray>::constBegin(in_stack_ffffffffffffff48);
  QHash<QString,_QByteArray>::constEnd((QHash<QString,_QByteArray> *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = QHash<QString,_QByteArray>::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff38,
                       (const_iterator *)in_stack_ffffffffffffff30);
    if (!bVar1) break;
    this_00 = (const_iterator *)(in_RDI + 2);
    in_stack_ffffffffffffff38 = &local_40;
    QHash<QString,_QByteArray>::const_iterator::key((const_iterator *)0x78ec38);
    QHash<QString,_QByteArray>::const_iterator::value((const_iterator *)0x78ec47);
    QHash<QString,_QByteArray>::insert
              ((QHash<QString,_QByteArray> *)in_stack_ffffffffffffff30,
               (QString *)in_stack_ffffffffffffff28,(QByteArray *)0x78ec59);
    QHash<QString,_QByteArray>::const_iterator::operator++(this_00);
  }
  OrderedNameMapMutexLocker::~OrderedNameMapMutexLocker((OrderedNameMapMutexLocker *)0x78ecb9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironmentPrivate::insert(const QProcessEnvironmentPrivate &other)
{
    auto it = other.vars.constBegin();
    const auto end = other.vars.constEnd();
    for ( ; it != end; ++it)
        vars.insert(it.key(), it.value());

#ifdef Q_OS_UNIX
    const OrderedNameMapMutexLocker locker(this, &other);
    auto nit = other.nameMap.constBegin();
    const auto nend = other.nameMap.constEnd();
    for ( ; nit != nend; ++nit)
        nameMap.insert(nit.key(), nit.value());
#endif
}